

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_four(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer pIVar2;
  Step SVar3;
  bool bVar4;
  size_t vertex0;
  Index IVar5;
  Index start_row;
  pair<bool,_unsigned_long> pVar6;
  reference rVar7;
  IndexPair local_40;
  
  start_row = 0;
  while( true ) {
    local_40 = find_zero(this,start_row);
    vertex0 = local_40.row;
    if ((vertex0 == 0xffffffffffffffff) || (local_40.col == 0xffffffffffffffff)) break;
    pvVar1 = this->mask_;
    pVar6 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                      (this->graph_,vertex0,local_40.col);
    (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [pVar6.second] = 2;
    bVar4 = has_star_in_row(this,vertex0);
    if (!bVar4) {
      pIVar2 = (this->path_).
               super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->path_).
          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
          ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
        (this->path_).
        super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
      }
      std::
      vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
      ::emplace_back<unsigned_long&,unsigned_long&>
                ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                  *)&this->path_,&local_40.row,&local_40.col);
      SVar3 = FIVE;
      goto LAB_00140add;
    }
    start_row = vertex0 + 1;
    IVar5 = find_star_in_row(this,vertex0);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->row_cover,vertex0);
    *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->col_cover,
                       IVar5 - ((long)(this->rows_).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->rows_).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    *rVar7._M_p = *rVar7._M_p & ~rVar7._M_mask;
  }
  SVar3 = SIX;
LAB_00140add:
  this->step_ = SVar3;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_four()
{
    IndexPair idx;
    Index start_row{ 0 };
    while (true) {

        idx = find_zero(start_row);

        if (idx.row == IDXMAX || idx.col == IDXMAX) {
            // No zero found.
            step_ = Step::SIX;
            return;
        }

        // it is more likely to find another zero
        // _after_ the last location, so we pass it
        // as a hint to find_zero.
        start_row = idx.row + 1;

        // prime at given index.
        mask_[graph_.findEdge(idx.row, idx.col).second] = PRIMED;

        if (has_star_in_row(idx.row)) {
            const auto col = find_star_in_row(idx.row);
            row_cover[idx.row] = true;
            col_cover[col_of_idx(col)] = false;
        } else {
            // starting point for augmenting path.
            path_.clear();
            path_.emplace_back(idx.row, idx.col);
            step_ = Step::FIVE;
            return;
        }
    }
}